

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curry.hpp
# Opt level: O2

Curried<std::function<int_(Thing_*,_int,_int,_int)>_> * __thiscall
lambda::curry<int,Thing,int,int,int>
          (Curried<std::function<int_(Thing_*,_int,_int,_int)>_> *__return_storage_ptr__,
          lambda *this,offset_in_Thing_to_subr fn)

{
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  (__return_storage_ptr__->f)._M_invoker =
       std::
       _Function_handler<int_(Thing_*,_int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/../lib/lambda/core/curry.hpp:60:9)>
       ::_M_invoke;
  *(lambda **)&(__return_storage_ptr__->f).super__Function_base._M_functor = this;
  *(offset_in_Thing_to_subr *)
   ((long)&(__return_storage_ptr__->f).super__Function_base._M_functor + 8) = fn;
  (__return_storage_ptr__->f).super__Function_base._M_manager =
       std::
       _Function_handler<int_(Thing_*,_int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/../lib/lambda/core/curry.hpp:60:9)>
       ::_M_manager;
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_unused._0_8_ = (undefined8)this;
  local_28._8_8_ = fn;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto curry(R (C::*fn)(Args...)) {
    return Curried<std::function<R(C *, Args...)>>(
        [fn](C *c, Args &&... ps) { return (c->*fn)(std::forward<decltype(ps)>(ps)...); });
}